

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O1

int amqp_tune_connection(amqp_connection_state_t state,int channel_max,int frame_max,int heartbeat)

{
  int iVar1;
  void *pvVar2;
  
  if (state->state == CONNECTION_STATE_IDLE) {
    state->channel_max = channel_max;
    state->frame_max = frame_max;
    iVar1 = 0;
    if (0 < heartbeat) {
      iVar1 = heartbeat;
    }
    state->heartbeat = iVar1;
    iVar1 = amqp_time_s_from_now(&state->next_send_heartbeat,iVar1);
    if (iVar1 == 0) {
      iVar1 = amqp_time_s_from_now(&state->next_recv_heartbeat,state->heartbeat * 2);
      if (iVar1 == 0) {
        (state->outbound_buffer).len = (long)frame_max;
        pvVar2 = realloc((state->outbound_buffer).bytes,(long)frame_max);
        if (pvVar2 == (void *)0x0) {
          iVar1 = -1;
        }
        else {
          (state->outbound_buffer).bytes = pvVar2;
          iVar1 = 0;
        }
      }
    }
    return iVar1;
  }
  amqp_abort("Programming error: invalid AMQP connection state: expected %d, got %d",0);
}

Assistant:

int amqp_tune_connection(amqp_connection_state_t state, int channel_max,
                         int frame_max, int heartbeat) {
  void *newbuf;
  int res;

  ENFORCE_STATE(state, CONNECTION_STATE_IDLE);

  state->channel_max = channel_max;
  state->frame_max = frame_max;

  state->heartbeat = heartbeat;
  if (0 > state->heartbeat) {
    state->heartbeat = 0;
  }

  res = amqp_time_s_from_now(&state->next_send_heartbeat,
                             amqp_heartbeat_send(state));
  if (AMQP_STATUS_OK != res) {
    return res;
  }
  res = amqp_time_s_from_now(&state->next_recv_heartbeat,
                             amqp_heartbeat_recv(state));
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  state->outbound_buffer.len = frame_max;
  newbuf = realloc(state->outbound_buffer.bytes, frame_max);
  if (newbuf == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }
  state->outbound_buffer.bytes = newbuf;

  return AMQP_STATUS_OK;
}